

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O0

void __thiscall
lsim::gui::CircuitEditor::set_simulation_instance
          (CircuitEditor *this,SimCircuit *sim_circuit,bool view_only)

{
  bool view_only_local;
  SimCircuit *sim_circuit_local;
  CircuitEditor *this_local;
  
  if ((sim_circuit != (SimCircuit *)0x0) && (this->m_sim_circuit == (SimCircuit *)0x0)) {
    this->m_state = CS_SIMULATING;
    this->m_view_only = view_only;
    clear_selection(this);
  }
  if ((sim_circuit == (SimCircuit *)0x0) && (this->m_sim_circuit != (SimCircuit *)0x0)) {
    this->m_state = CS_IDLE;
    this->m_view_only = false;
  }
  this->m_sim_circuit = sim_circuit;
  return;
}

Assistant:

void CircuitEditor::set_simulation_instance(SimCircuit *sim_circuit, bool view_only) {

	if (sim_circuit != nullptr && m_sim_circuit == nullptr) {
		m_state = CS_SIMULATING;
		m_view_only = view_only;
		clear_selection();
	}

	if (sim_circuit == nullptr && m_sim_circuit != nullptr) {
		m_state = CS_IDLE;
		m_view_only = false;
	}

	m_sim_circuit = sim_circuit;
}